

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshmbuffer.c
# Opt level: O1

pssize p_shm_buffer_get_used_space(PShmBuffer *buf,PError **error)

{
  pboolean pVar1;
  psize pVar2;
  
  if (buf == (PShmBuffer *)0x0) {
    p_error_set_error_p(error,0x25f,0,"Invalid input argument");
  }
  else {
    pVar1 = p_shm_lock(buf->shm,error);
    if (pVar1 != 0) {
      pVar2 = pp_shm_buffer_get_used_space(buf);
      pVar1 = p_shm_unlock(buf->shm,error);
      return -(ulong)(pVar1 == 0) | pVar2;
    }
  }
  return -1;
}

Assistant:

P_LIB_API pssize
p_shm_buffer_get_used_space (PShmBuffer	*buf,
			     PError	**error)
{
	psize space;

	if (P_UNLIKELY (buf == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return -1;
	}

	if (P_UNLIKELY (p_shm_lock (buf->shm, error) == FALSE))
		return -1;

	space = pp_shm_buffer_get_used_space (buf);

	if (P_UNLIKELY (p_shm_unlock (buf->shm, error) == FALSE))
		return -1;

	return (pssize) space;
}